

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepLoop *L)

{
  int loop_index;
  TYPE looptype;
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TYPE TVar5;
  uint ti;
  ON_BrepLoop *pOVar6;
  ON_BrepFace *pOVar7;
  ON_BrepLoop *this_00;
  ON_BrepTrim *pOVar8;
  ON_BrepTrim *pOVar9;
  char *sFormat;
  int iVar10;
  TYPE TVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  ON_SimpleArray<int> *this_01;
  long lVar17;
  ulong uVar18;
  int lti1;
  int lti0;
  uint local_78;
  uint local_74;
  long local_70;
  ulong local_68;
  ulong local_60;
  ON_BrepTrim *local_58;
  ON_BrepTrim *local_50;
  ulong local_48;
  ON_BrepFace *local_40;
  undefined8 local_38;
  
  loop_index = L->m_loop_index;
  uVar12 = 0;
  do {
    pOVar6 = Loop(this,loop_index);
    bVar2 = FoundSlitPair(pOVar6,(int *)&local_74,(int *)&local_78);
    uVar14 = local_74;
    uVar13 = local_78;
    if (!bVar2) break;
    lVar15 = (long)(int)local_74;
    lVar17 = (long)(int)local_78;
    pOVar6 = Loop(this,loop_index);
    uVar3 = ON_BrepLoop::TrimCount(pOVar6);
    if ((int)uVar14 < 0 || (int)uVar3 <= (int)uVar14) {
      iVar10 = 0xa83;
      sFormat = "lti0>=0 && lti0<trim_count is false";
LAB_0041a48c:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_tools.cpp"
                 ,iVar10,"",sFormat);
LAB_0041a493:
      this_00 = (ON_BrepLoop *)0x0;
      bVar16 = 0;
    }
    else {
      if ((int)uVar13 < 0 || (int)uVar3 <= (int)uVar13) {
        iVar10 = 0xa84;
        sFormat = "lti1>=0 && lti1<trim_count is false";
        goto LAB_0041a48c;
      }
      if (uVar14 == uVar13) {
        iVar10 = 0xa85;
        sFormat = "lti0!=lti1 is false";
        goto LAB_0041a48c;
      }
      pOVar7 = ON_BrepLoop::Face(pOVar6);
      this_00 = (ON_BrepLoop *)0x0;
      bVar16 = 0;
      if (((-1 < loop_index) && (pOVar7 != (ON_BrepFace *)0x0)) &&
         (loop_index <
          (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count)) {
        iVar10 = (int)((uVar14 - uVar13) + uVar3) % (int)uVar3;
        if ((iVar10 != 1) && (iVar10 != uVar3 - 1)) {
          looptype = pOVar6->m_type;
          if (looptype - outer < 2) {
            local_68 = (ulong)uVar3;
            local_48 = (ulong)looptype;
            local_40 = pOVar7;
            local_38 = uVar12;
            this_00 = NewLoop(this,looptype);
            pOVar6 = Loop(this,loop_index);
            uVar3 = uVar13;
            if ((int)uVar13 < (int)uVar14) {
              uVar3 = uVar14;
            }
            if ((int)uVar14 < (int)uVar13) {
              uVar13 = uVar14;
            }
            uVar18 = (ulong)uVar13;
            local_70 = lVar17;
            pOVar8 = ON_BrepLoop::Trim(pOVar6,uVar13);
            local_58 = ON_BrepLoop::Trim(pOVar6,uVar3);
            pOVar8->m_li = -1;
            local_58->m_li = -1;
            piVar1 = (pOVar6->m_ti).m_a;
            piVar1[uVar18] = -1;
            piVar1[uVar3] = -1;
            uVar13 = uVar13 + 1;
            local_60 = uVar18;
            local_50 = pOVar8;
            if ((int)uVar13 < (int)uVar3) {
              lVar17 = (ulong)uVar13 << 2;
              do {
                pOVar8 = ON_BrepLoop::Trim(pOVar6,uVar13);
                ON_SimpleArray<int>::Append
                          (&this_00->m_ti,(int *)((long)(pOVar6->m_ti).m_a + lVar17));
                pOVar8->m_li = this_00->m_loop_index;
                *(undefined4 *)((long)(pOVar6->m_ti).m_a + lVar17) = 0xffffffff;
                uVar13 = uVar13 + 1;
                lVar17 = lVar17 + 4;
              } while ((int)uVar13 < (int)uVar3);
            }
            uVar12 = local_38;
            uVar3 = uVar3 + 1;
            iVar4 = (int)local_60;
            iVar10 = iVar4;
            if ((int)uVar3 < (int)local_68) {
              piVar1 = (pOVar6->m_ti).m_a;
              lVar17 = 0;
              do {
                piVar1[local_60 + lVar17] = piVar1[(ulong)uVar3 + lVar17];
                lVar17 = lVar17 + 1;
              } while ((int)((int)lVar17 + uVar3) < (int)local_68);
              if (local_70 < lVar15) {
                uVar14 = (uint)local_70;
              }
              iVar10 = (int)lVar17 + uVar14;
            }
            if (iVar10 <= (pOVar6->m_ti).m_capacity) {
              (pOVar6->m_ti).m_count = iVar10;
            }
            this_00->m_fi = pOVar6->m_fi;
            pOVar8 = ON_BrepLoop::Trim(this_00,0);
            iVar10 = ON_BrepLoop::TrimCount(this_00);
            pOVar9 = ON_BrepLoop::Trim(this_00,iVar10 + -1);
            MatchTrimEnds(this,pOVar9,pOVar8);
            iVar10 = ON_BrepLoop::TrimCount(pOVar6);
            pOVar8 = ON_BrepLoop::Trim(pOVar6,(iVar4 + iVar10 + -1) % iVar10);
            pOVar9 = ON_BrepLoop::Trim(pOVar6,(int)uVar3 % iVar10);
            MatchTrimEnds(this,pOVar8,pOVar9);
            DeleteTrim(this,local_50,true);
            DeleteTrim(this,local_58,true);
            TVar5 = ComputeLoopType(this,pOVar6);
            pOVar6->m_type = TVar5;
            TVar5 = ComputeLoopType(this,this_00);
            this_00->m_type = TVar5;
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,pOVar6,0);
            (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,this_00,0);
            pOVar7 = local_40;
            TVar5 = pOVar6->m_type;
            TVar11 = (TYPE)local_48;
            if (TVar5 == TVar11) {
              if (this_00->m_type == outer) {
                pOVar7 = NewFace(this,local_40->m_si);
                ON_SimpleArray<int>::Append(&pOVar7->m_li,&this_00->m_loop_index);
                this_00->m_fi = pOVar7->m_face_index;
              }
              else {
                if (this_00->m_type != inner) goto LAB_0041a906;
                this_00->m_fi = pOVar6->m_fi;
                ON_SimpleArray<int>::Append(&local_40->m_li,&this_00->m_loop_index);
              }
              bVar16 = 1;
            }
            else {
LAB_0041a906:
              if (TVar11 == outer) {
                bVar2 = TVar5 == inner;
LAB_0041a9d1:
                if ((!bVar2) || (this_00->m_type != outer)) goto LAB_0041a8ff;
                this_00->m_fi = pOVar6->m_fi;
                ON_SimpleArray<int>::Insert(&local_40->m_li,0,&this_00->m_loop_index);
                bVar16 = 1;
              }
              else if (TVar11 == inner) {
                if ((TVar5 != outer) || (this_00->m_type != inner)) {
                  bVar2 = false;
                  goto LAB_0041a9d1;
                }
                this_00->m_fi = pOVar6->m_fi;
                this_01 = &local_40->m_li;
                ON_SimpleArray<int>::Append(this_01,&this_00->m_loop_index);
                iVar10 = ON_BrepFace::LoopCount(pOVar7);
                if (0 < iVar10) {
                  lVar15 = 0;
                  do {
                    if ((pOVar7->m_li).m_a[lVar15] == pOVar6->m_loop_index) {
                      ON_SimpleArray<int>::Remove(this_01,(int)lVar15);
                      break;
                    }
                    lVar15 = lVar15 + 1;
                    iVar10 = ON_BrepFace::LoopCount(pOVar7);
                  } while (lVar15 < iVar10);
                }
                pOVar7 = NewFace(this,pOVar7->m_si);
                ON_SimpleArray<int>::Append(&pOVar7->m_li,&pOVar6->m_loop_index);
                pOVar6->m_fi = pOVar7->m_face_index;
                bVar16 = 1;
              }
              else {
                bVar16 = 0;
              }
            }
          }
          else {
            this_00 = (ON_BrepLoop *)0x0;
LAB_0041a8ff:
            bVar16 = 0;
          }
          bVar16 = looptype - outer < 2 & bVar16;
          goto LAB_0041a498;
        }
        pOVar8 = ON_BrepLoop::Trim(pOVar6,uVar14);
        uVar14 = pOVar8->m_trim_index;
        pOVar8 = ON_BrepLoop::Trim(pOVar6,uVar13);
        uVar13 = pOVar8->m_trim_index;
        ti = PrevTrim(this,uVar14);
        uVar3 = uVar13;
        if (ti == uVar13) {
          ti = PrevTrim(this,uVar13);
          uVar3 = uVar14;
        }
        uVar3 = NextTrim(this,uVar3);
        if (-1 < (int)uVar14) {
          iVar10 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                   m_count;
          this_00 = (ON_BrepLoop *)0x0;
          bVar16 = 0;
          if ((((int)uVar14 <= iVar10) && (-1 < (int)uVar13)) && ((int)uVar13 <= iVar10)) {
            pOVar8 = Trim(this,uVar14);
            DeleteTrim(this,pOVar8,true);
            pOVar8 = Trim(this,uVar13);
            DeleteTrim(this,pOVar8,true);
            bVar16 = 1;
            if (((uVar14 != ti && uVar13 != ti) && -1 < (int)(ti | uVar3)) &&
               (uVar13 = NextTrim(this,ti), uVar13 == uVar3)) {
              pOVar8 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                       super_ON_ClassArray<ON_BrepTrim>.m_a;
              MatchTrimEnds(this,pOVar8 + (int)ti,pOVar8 + (int)uVar3);
              (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,pOVar6,0);
            }
            this_00 = (ON_BrepLoop *)0x0;
          }
          goto LAB_0041a498;
        }
        goto LAB_0041a493;
      }
    }
LAB_0041a498:
    if (this_00 != (ON_BrepLoop *)0x0 && bVar16 == 1) {
      RemoveSlits(this,this_00);
    }
    uVar12 = CONCAT71((int7)((ulong)uVar12 >> 8),(byte)uVar12 | bVar16);
  } while (bVar16 != 0);
  pOVar6 = Loop(this,loop_index);
  if ((pOVar6 != (ON_BrepLoop *)0x0) &&
     (pOVar6 = Loop(this,loop_index), (pOVar6->m_ti).m_count == 0)) {
    pOVar6 = Loop(this,loop_index);
    DeleteLoop(this,pOVar6,true);
  }
  return (bool)((byte)uVar12 & 1);
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepLoop& L)

{
  bool rc = false;
  bool rval = true;
  const int li = L.m_loop_index;

  int lti0, lti1;
  while (rval && FoundSlitPair(*Loop(li), &lti0, &lti1)){ 
    ON_BrepLoop* newloop = nullptr;
		// Warning- This can add a loop and or face causing
		//  reallocation of arrays so refernces (like L) are
		//  no longer valid.
    rval = RemoveSlitPair(*this, li, lti0, lti1, newloop);
    rc = rc || rval;
    if(rval && newloop)
      RemoveSlits(*newloop);
  }

	// 22-Oct-2009 Crash Fix TRR#55897
  if (Loop(li) && Loop(li)->m_ti.Count() == 0) 
    DeleteLoop(*Loop(li), true);
  
  return rc;
}